

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Check.cpp
# Opt level: O3

void __thiscall Check::~Check(Check *this)

{
  pointer pcVar1;
  
  (this->super_Payment)._vptr_Payment = (_func_int **)&PTR__Check_00110bc0;
  pcVar1 = (this->bankID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->bankID).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  Payment::~Payment(&this->super_Payment);
  return;
}

Assistant:

Check::~Check() {

}